

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.hpp
# Opt level: O3

bool adiak::value<adiak::path>(string *name,path *value,int category,string *subcategory)

{
  bool bVar1;
  int iVar2;
  adiak_datatype_t *type;
  adiak_value_t *val;
  
  type = adiak_get_basetype(adiak_path);
  if (type != (adiak_datatype_t *)0x0) {
    val = (adiak_value_t *)malloc(8);
    bVar1 = internal::parse<adiak::path>::make_value(value,val,type);
    if (bVar1) {
      iVar2 = adiak_raw_namevalue((name->_M_dataplus)._M_p,category,(subcategory->_M_dataplus)._M_p,
                                  val,type);
      return iVar2 == 0;
    }
  }
  return false;
}

Assistant:

bool value(std::string name, T value, int category = adiak_general, std::string subcategory = "") {
      adiak_datatype_t *datatype = adiak::internal::parse<T>::make_type();
      if (!datatype)
         return false;
      adiak_value_t *avalue = (adiak_value_t *) malloc(sizeof(adiak_value_t));
      bool result = adiak::internal::parse<T>::make_value(value, avalue, datatype);
      if (!result)
         return false;
      return adiak_raw_namevalue(name.c_str(), category, subcategory.c_str(), avalue, datatype) == 0;
   }